

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O2

TString * __thiscall
glslang::TType::getBasicTypeString_abi_cxx11_(TString *__return_storage_ptr__,TType *this)

{
  char *__s;
  pool_allocator<char> local_18;
  
  if (this->field_0x8 == '\x0e') {
    TSampler::getString_abi_cxx11_(__return_storage_ptr__,&this->sampler);
  }
  else {
    __s = getBasicString(this);
    local_18.allocator = GetThreadPoolAllocator();
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    basic_string<glslang::std::allocator<char>>
              ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
               __return_storage_ptr__,__s,&local_18);
  }
  return __return_storage_ptr__;
}

Assistant:

TString getBasicTypeString() const
    {
        if (basicType == EbtSampler)
            return sampler.getString();
        else
            return getBasicString();
    }